

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O1

void luaS_clearcache(global_State *g)

{
  TString *(*papTVar1) [2];
  long lVar2;
  long lVar3;
  
  papTVar1 = g->strcache;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      if (((*papTVar1)[lVar3]->marked & 0x18) != 0) {
        (*papTVar1)[lVar3] = g->memerrmsg;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    lVar2 = lVar2 + 1;
    papTVar1 = papTVar1 + 1;
  } while (lVar2 != 0x35);
  return;
}

Assistant:

void luaS_clearcache (global_State *g) {
  int i, j;
  for (i = 0; i < STRCACHE_N; i++)
    for (j = 0; j < STRCACHE_M; j++) {
      if (iswhite(g->strcache[i][j]))  /* will entry be collected? */
        g->strcache[i][j] = g->memerrmsg;  /* replace it with something fixed */
    }
}